

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_35::SwiftCodeGenerator::GenerateCode
          (SwiftCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  SwiftGenerator generator;
  SwiftGenerator local_430;
  
  swift::SwiftGenerator::SwiftGenerator(&local_430,parser,path,filename);
  bVar1 = swift::SwiftGenerator::generate(&local_430);
  swift::SwiftGenerator::~SwiftGenerator(&local_430);
  return (Status)!bVar1;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateSwift(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }